

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

void Rnm_ManVerifyUsingTerSim
               (Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,Vec_Int_t *vObjs,Vec_Int_t *vRes)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int local_4c;
  
  uVar16 = 0x4000000000000000;
  local_4c = pCex->nRegs;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  if (-1 < pCex->iFrame) {
    iVar4 = 0;
    do {
      if (0 < vMap->nSize) {
        lVar13 = 0;
        do {
          iVar2 = vMap->pArray[lVar13];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0062296c;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar2;
          uVar8 = local_4c + (int)lVar13;
          uVar8 = (uint)(((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0);
          pGVar5->Value = uVar8;
          uVar17 = *(ulong *)pGVar5;
          if ((((uint)uVar17 & 0x9fffffff) == 0x9fffffff) &&
             ((int)((uint)(uVar17 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
            if (uVar8 == 0) {
              uVar17 = uVar17 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar17 = uVar17 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          else {
            uVar17 = uVar17 | 0x4000000040000000;
          }
          *(ulong *)pGVar5 = uVar17;
          lVar13 = lVar13 + 1;
        } while (lVar13 < vMap->nSize);
      }
      if (0 < vRes->nSize) {
        lVar13 = 0;
        do {
          lVar14 = (long)vRes->pArray[lVar13];
          if ((lVar14 < 0) || (p->nObjs <= vRes->pArray[lVar13])) goto LAB_0062296c;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar17 = uVar16;
          if (pGVar5[lVar14].Value == 0) {
            uVar17 = 0x40000000;
          }
          *(ulong *)(pGVar5 + lVar14) = uVar17 | *(ulong *)(pGVar5 + lVar14) & 0xbfffffffbfffffff;
          lVar13 = lVar13 + 1;
        } while (lVar13 < vRes->nSize);
      }
      if (0 < vObjs->nSize) {
        lVar13 = 0;
        do {
          uVar17 = 0xbfffffffbfffffff;
          iVar2 = vObjs->pArray[lVar13];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0062296c;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar5 + iVar2;
          uVar15 = *(ulong *)pGVar1;
          uVar8 = (uint)uVar15;
          uVar12 = uVar15 & 0x1fffffff;
          if (uVar12 == 0x1fffffff || -1 < (int)uVar8) {
            uVar11 = (uint)(uVar15 >> 0x20);
            if ((int)uVar8 < 0 || (int)uVar12 == 0x1fffffff) {
              if (iVar4 != 0) {
                if ((uVar8 & 0x9fffffff) != 0x9fffffff) {
LAB_006229aa:
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar11 = uVar11 & 0x1fffffff;
                iVar2 = p->vCis->nSize;
                if ((int)uVar11 < iVar2 - p->nRegs) goto LAB_006229aa;
                iVar3 = p->vCos->nSize;
                uVar11 = (iVar3 - iVar2) + uVar11;
                if ((-1 < (int)uVar11) && ((int)uVar11 < iVar3)) {
                  uVar8 = p->vCos->pArray[uVar11];
                  lVar14 = (long)(int)uVar8;
                  if ((-1 < lVar14) && (uVar8 < (uint)p->nObjs)) {
                    if ((*(ulong *)(pGVar5 + lVar14) & 0x4000000040000000) == 0) {
                      __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                    ,0x3b5,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    uVar17 = *(ulong *)(pGVar5 + lVar14) & 0x40000000;
                    *(ulong *)pGVar1 = uVar15 & 0xffffffffbfffffff | uVar17;
                    uVar15 = uVar15 & 0xbfffffffbfffffff | uVar17 |
                             *(ulong *)(pGVar5 + lVar14) & 0x4000000000000000;
                    goto LAB_00622886;
                  }
                  goto LAB_0062296c;
                }
                goto LAB_00622a07;
              }
            }
            else {
              uVar17 = *(ulong *)(pGVar1 + -uVar12) & 0x4000000040000000;
              if (uVar17 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              uVar12 = *(ulong *)(pGVar1 + -(ulong)(uVar11 & 0x1fffffff)) & 0x4000000040000000;
              if (uVar12 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x39e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              uVar9 = uVar16;
              if ((uVar8 >> 0x1d & 1) == 0) {
                uVar9 = 0x40000000;
              }
              if (uVar17 != uVar9) {
                uVar9 = uVar16;
                if ((uVar15 >> 0x3d & 1) == 0) {
                  uVar9 = 0x40000000;
                }
                if (uVar12 != uVar9) {
                  uVar9 = 0x40000000;
                  if ((uVar8 >> 0x1d & 1) == 0) {
                    uVar9 = uVar16;
                  }
                  uVar10 = 0x40000000;
                  if ((uVar15 >> 0x3d & 1) == 0) {
                    uVar10 = uVar16;
                  }
                  if ((uVar17 == uVar9) && (uVar12 == uVar10)) {
                    uVar17 = 0xbfffffff3fffffff;
                    goto LAB_0062287e;
                  }
                  goto LAB_00622883;
                }
              }
              uVar17 = 0xbfffffff3fffffff;
            }
LAB_0062283b:
            uVar15 = uVar15 & uVar17 | 0x40000000;
          }
          else {
            uVar12 = *(ulong *)(pGVar1 + -uVar12) & 0x4000000040000000;
            if (uVar12 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x3a9,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
            }
            if (((uVar8 >> 0x1d & 1) != 0) && (uVar12 == 0x4000000000000000)) goto LAB_0062283b;
            if (uVar12 == 0x4000000000000000) {
              if ((uVar8 >> 0x1d & 1) == 0) {
LAB_0062287e:
                uVar15 = uVar15 & uVar17 | 0x4000000000000000;
                goto LAB_00622886;
              }
            }
            else if (uVar12 == 0x40000000) {
              if ((uVar8 >> 0x1d & 1) != 0) goto LAB_0062287e;
              goto LAB_0062283b;
            }
LAB_00622883:
            uVar15 = uVar15 | 0x4000000040000000;
          }
LAB_00622886:
          *(ulong *)pGVar1 = uVar15;
          lVar13 = lVar13 + 1;
        } while (lVar13 < vObjs->nSize);
      }
      local_4c = local_4c + pCex->nPis;
      bVar7 = iVar4 < pCex->iFrame;
      iVar4 = iVar4 + 1;
    } while (bVar7);
  }
  iVar4 = vMap->nSize;
  if (0 < (long)iVar4) {
    piVar6 = vMap->pArray;
    lVar13 = 0;
    do {
      iVar2 = piVar6[lVar13];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0062296c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar2].Value = 0;
      lVar13 = lVar13 + 1;
    } while (iVar4 != lVar13);
  }
  iVar4 = p->vCos->nSize;
  if (iVar4 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar4 < 1) {
LAB_00622a07:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *p->vCos->pArray;
  if ((-1 < (long)iVar4) && (iVar4 < p->nObjs)) {
    if (((undefined1  [12])p->pObjs[iVar4] & (undefined1  [12])0x4000000040000000) !=
        (undefined1  [12])0x4000000000000000) {
      Abc_Print((int)p,"\nRefinement verification has failed!!!\n");
      return;
    }
    return;
  }
LAB_0062296c:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Rnm_ManVerifyUsingTerSim( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, Vec_Int_t * vObjs, Vec_Int_t * vRes )
{
    Gia_Obj_t * pObj;
    int i, f, iBit = pCex->nRegs;
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    for ( f = 0; f <= pCex->iFrame; f++, iBit += pCex->nPis )
    {
        Gia_ManForEachObjVec( vMap, p, pObj, i )
        {
            pObj->Value = Abc_InfoHasBit( pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p, pObj) )
                Gia_ObjTerSimSetX( pObj );
            else if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vRes, p, pObj, i ) // vRes is subset of vMap
        {
            if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vObjs, p, pObj, i )
        {
            if ( Gia_ObjIsCo(pObj) )
                Gia_ObjTerSimCo( pObj );
            else if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjTerSimAnd( pObj );
            else if ( f == 0 )
                Gia_ObjTerSimSet0( pObj );
            else
                Gia_ObjTerSimRo( p, pObj );
        }
    }
    Gia_ManForEachObjVec( vMap, p, pObj, i )
        pObj->Value = 0;
    pObj = Gia_ManPo( p, 0 );
    if ( !Gia_ObjTerSimGet1(pObj) )
        Abc_Print( 1, "\nRefinement verification has failed!!!\n" );
}